

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O1

VP8Encoder * InitVP8Encoder(WebPConfig *config,WebPPicture *picture)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  VP8Encoder *enc;
  VP8RDLevel VVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  LFStats *paadVar11;
  long lVar12;
  int iVar13;
  WebPConfig *config_1;
  uint8_t *puVar14;
  DError *paaiVar15;
  long lVar16;
  VP8MBInfo *pVVar17;
  int iVar18;
  int local_40;
  
  bVar1 = true;
  if (config->filter_strength < 1) {
    bVar1 = 0 < config->autofilter;
  }
  uVar10 = (long)picture->width + 0xf;
  iVar18 = (int)uVar10 >> 4;
  iVar13 = picture->height + 0xf >> 4;
  iVar7 = iVar18 * 4 + 1;
  lVar16 = (long)((iVar13 * 4 + 1) * iVar7);
  uVar10 = uVar10 & 0xfffffffffffffff0;
  lVar8 = (long)iVar18;
  lVar5 = (long)(iVar13 * iVar18);
  iVar4 = config->autofilter;
  lVar12 = 0x81f;
  if (iVar4 == 0) {
    lVar12 = 0;
  }
  lVar2 = uVar10 * 2;
  if ((config->quality <= 98.0) || (1 < config->pass)) {
    lVar9 = lVar8 << 2;
  }
  else {
    lVar9 = 0;
  }
  enc = (VP8Encoder *)
        WebPSafeMalloc(lVar9 + lVar2 + lVar12 + lVar8 * 4 + lVar5 * 4 + lVar16 + 0x5cf9,1);
  if (enc == (VP8Encoder *)0x0) {
    picture->error_code = VP8_ENC_ERROR_OUT_OF_MEMORY;
    enc = (VP8Encoder *)0x0;
  }
  else {
    pVVar17 = (VP8MBInfo *)
              ((ulong)((long)&enc[1].filter_hdr_.i4x4_lf_delta_ + 3U) & 0xffffffffffffffe0);
    memset(enc,0,0x5c98);
    enc->num_parts_ = 1 << ((byte)config->partitions & 0x1f);
    enc->mb_w_ = iVar18;
    enc->mb_h_ = iVar13;
    enc->preds_w_ = iVar7;
    enc->mb_info_ = pVVar17;
    enc->preds_ = &pVVar17[lVar5].alpha_ + iVar7;
    paadVar11 = (LFStats *)0x0;
    if (iVar4 != 0) {
      paadVar11 = (LFStats *)
                  ((ulong)(&pVVar17[lVar5 + lVar8 + 0x10].field_0x2 + lVar16) & 0xffffffffffffffe0);
    }
    enc->nz_ = (uint32_t *)
               ((ulong)(&pVVar17[lVar5 + 7].field_0x3 + lVar16) & 0xffffffffffffffe0 | 4);
    enc->lf_stats_ = paadVar11;
    puVar14 = (uint8_t *)
              ((ulong)(&pVVar17[lVar5 + lVar8 + 0x10].field_0x2 + lVar16 + lVar12) &
              0xffffffffffffffe0);
    enc->y_top_ = puVar14;
    local_40 = (int)uVar10;
    enc->uv_top_ = puVar14 + local_40;
    paaiVar15 = (DError *)(puVar14 + lVar2);
    if (lVar9 == 0) {
      paaiVar15 = (DError *)0x0;
    }
    enc->top_derr_ = paaiVar15;
    enc->config_ = config;
    uVar3 = 2;
    if (bVar1) {
      uVar3 = (uint)(config->filter_type != 1);
    }
    enc->profile_ = uVar3;
    enc->pic_ = picture;
    enc->percent_ = 0;
    iVar4 = 100 - config->partition_limit;
    iVar7 = config->method;
    enc->method_ = iVar7;
    VVar6 = RD_OPT_TRELLIS_ALL;
    if ((iVar7 < 6) && (VVar6 = RD_OPT_TRELLIS, iVar7 != 5)) {
      VVar6 = (VP8RDLevel)(2 < iVar7);
    }
    enc->rd_opt_level_ = VVar6;
    enc->max_i4_header_bits_ = (uint)(iVar4 * iVar4 * 0x10000) / 10000;
    enc->mb_header_limit_ = SUB164((ZEXT416(0) << 0x40 | ZEXT816(0x3fc00000)) / SEXT816(lVar5),0);
    enc->thread_level_ = config->thread_level;
    uVar3 = 1;
    if (config->target_size < 1) {
      uVar3 = (uint)(0.0 < config->target_PSNR);
    }
    enc->do_search_ = uVar3;
    if ((config->low_memory == 0) &&
       (enc->use_tokens_ = (uint)(VVar6 != RD_OPT_NONE), VVar6 != RD_OPT_NONE)) {
      enc->num_parts_ = 1;
    }
    VP8EncDspInit();
    VP8DefaultProbas(enc);
    iVar7 = enc->config_->segments;
    (enc->segment_hdr_).num_segments_ = iVar7;
    (enc->segment_hdr_).update_map_ = (uint)(1 < iVar7);
    (enc->segment_hdr_).size_ = 0;
    (enc->filter_hdr_).simple_ = 1;
    (enc->filter_hdr_).level_ = 0;
    (enc->filter_hdr_).sharpness_ = 0;
    (enc->filter_hdr_).i4x4_lf_delta_ = 0;
    puVar14 = enc->preds_;
    if (-1 < enc->mb_w_) {
      iVar7 = enc->preds_w_;
      lVar12 = -1;
      do {
        puVar14[lVar12 - iVar7] = '\0';
        lVar12 = lVar12 + 1;
      } while (lVar12 < (long)enc->mb_w_ * 4);
    }
    if (0 < enc->mb_h_) {
      iVar7 = 0;
      do {
        puVar14[(long)enc->preds_w_ * (long)iVar7 + -1] = '\0';
        iVar7 = iVar7 + 1;
      } while (iVar7 < enc->mb_h_ * 4);
    }
    enc->nz_[-1] = 0;
    VP8EncDspCostInit();
    VP8EncInitAlpha(enc);
    VP8TBufferInit(&enc->tokens_,
                   (int)((float)(iVar13 * iVar18 * 4) * ((config->quality * 5.0) / 100.0 + 1.0)));
  }
  return enc;
}

Assistant:

static VP8Encoder* InitVP8Encoder(const WebPConfig* const config,
                                  WebPPicture* const picture) {
  VP8Encoder* enc;
  const int use_filter =
      (config->filter_strength > 0) || (config->autofilter > 0);
  const int mb_w = (picture->width + 15) >> 4;
  const int mb_h = (picture->height + 15) >> 4;
  const int preds_w = 4 * mb_w + 1;
  const int preds_h = 4 * mb_h + 1;
  const size_t preds_size = preds_w * preds_h * sizeof(*enc->preds_);
  const int top_stride = mb_w * 16;
  const size_t nz_size = (mb_w + 1) * sizeof(*enc->nz_) + WEBP_ALIGN_CST;
  const size_t info_size = mb_w * mb_h * sizeof(*enc->mb_info_);
  const size_t samples_size =
      2 * top_stride * sizeof(*enc->y_top_)  // top-luma/u/v
      + WEBP_ALIGN_CST;                      // align all
  const size_t lf_stats_size =
      config->autofilter ? sizeof(*enc->lf_stats_) + WEBP_ALIGN_CST : 0;
  const size_t top_derr_size =
      (config->quality <= ERROR_DIFFUSION_QUALITY || config->pass > 1) ?
          mb_w * sizeof(*enc->top_derr_) : 0;
  uint8_t* mem;
  const uint64_t size = (uint64_t)sizeof(*enc)   // main struct
                      + WEBP_ALIGN_CST           // cache alignment
                      + info_size                // modes info
                      + preds_size               // prediction modes
                      + samples_size             // top/left samples
                      + top_derr_size            // top diffusion error
                      + nz_size                  // coeff context bits
                      + lf_stats_size;           // autofilter stats

#ifdef PRINT_MEMORY_INFO
  printf("===================================\n");
  printf("Memory used:\n"
         "             encoder: %ld\n"
         "                info: %ld\n"
         "               preds: %ld\n"
         "         top samples: %ld\n"
         "       top diffusion: %ld\n"
         "            non-zero: %ld\n"
         "            lf-stats: %ld\n"
         "               total: %ld\n",
         sizeof(*enc) + WEBP_ALIGN_CST, info_size,
         preds_size, samples_size, top_derr_size, nz_size, lf_stats_size, size);
  printf("Transient object sizes:\n"
         "      VP8EncIterator: %ld\n"
         "        VP8ModeScore: %ld\n"
         "      VP8SegmentInfo: %ld\n"
         "         VP8EncProba: %ld\n"
         "             LFStats: %ld\n",
         sizeof(VP8EncIterator), sizeof(VP8ModeScore),
         sizeof(VP8SegmentInfo), sizeof(VP8EncProba),
         sizeof(LFStats));
  printf("Picture size (yuv): %ld\n",
         mb_w * mb_h * 384 * sizeof(uint8_t));
  printf("===================================\n");
#endif
  mem = (uint8_t*)WebPSafeMalloc(size, sizeof(*mem));
  if (mem == NULL) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    return NULL;
  }
  enc = (VP8Encoder*)mem;
  mem = (uint8_t*)WEBP_ALIGN(mem + sizeof(*enc));
  memset(enc, 0, sizeof(*enc));
  enc->num_parts_ = 1 << config->partitions;
  enc->mb_w_ = mb_w;
  enc->mb_h_ = mb_h;
  enc->preds_w_ = preds_w;
  enc->mb_info_ = (VP8MBInfo*)mem;
  mem += info_size;
  enc->preds_ = mem + 1 + enc->preds_w_;
  mem += preds_size;
  enc->nz_ = 1 + (uint32_t*)WEBP_ALIGN(mem);
  mem += nz_size;
  enc->lf_stats_ = lf_stats_size ? (LFStats*)WEBP_ALIGN(mem) : NULL;
  mem += lf_stats_size;

  // top samples (all 16-aligned)
  mem = (uint8_t*)WEBP_ALIGN(mem);
  enc->y_top_ = mem;
  enc->uv_top_ = enc->y_top_ + top_stride;
  mem += 2 * top_stride;
  enc->top_derr_ = top_derr_size ? (DError*)mem : NULL;
  mem += top_derr_size;
  assert(mem <= (uint8_t*)enc + size);

  enc->config_ = config;
  enc->profile_ = use_filter ? ((config->filter_type == 1) ? 0 : 1) : 2;
  enc->pic_ = picture;
  enc->percent_ = 0;

  MapConfigToTools(enc);
  VP8EncDspInit();
  VP8DefaultProbas(enc);
  ResetSegmentHeader(enc);
  ResetFilterHeader(enc);
  ResetBoundaryPredictions(enc);
  VP8EncDspCostInit();
  VP8EncInitAlpha(enc);

  // lower quality means smaller output -> we modulate a little the page
  // size based on quality. This is just a crude 1rst-order prediction.
  {
    const float scale = 1.f + config->quality * 5.f / 100.f;  // in [1,6]
    VP8TBufferInit(&enc->tokens_, (int)(mb_w * mb_h * 4 * scale));
  }
  return enc;
}